

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O2

size_t pstore::repo::generic_section::
       size_bytes<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
                 (pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
                  *d,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
                     *i,pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
                        *x)

{
  ulong num_ifixups;
  size_t sVar1;
  ulong num_xfixups;
  ulong data_size;
  
  data_size = (long)(d->second).pos_ - (long)(d->first).pos_;
  num_ifixups = ((long)(i->second)._M_current - (long)(i->first)._M_current) / 0x18;
  num_xfixups = (long)(x->second)._M_current - (long)(x->first)._M_current >> 5;
  if (-1 < (long)(num_ifixups | data_size | num_xfixups)) {
    sVar1 = size_bytes(data_size,num_ifixups,num_xfixups);
    return sVar1;
  }
  assert_failed("data_size >= 0 && num_ifixups >= 0 && num_xfixups >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/generic_section.hpp"
                ,0x178);
}

Assistant:

std::size_t generic_section::size_bytes (DataRange const & d, IFixupRange const & i,
                                                 XFixupRange const & x) {
            auto const data_size = std::distance (d.first, d.second);
            auto const num_ifixups = std::distance (i.first, i.second);
            auto const num_xfixups = std::distance (x.first, x.second);
            PSTORE_ASSERT (data_size >= 0 && num_ifixups >= 0 && num_xfixups >= 0);
            return size_bytes (static_cast<std::size_t> (data_size),
                               static_cast<std::size_t> (num_ifixups),
                               static_cast<std::size_t> (num_xfixups));
        }